

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O1

bool __thiscall
jbcoin::base_uint<128UL,_void>::SetHex(base_uint<128UL,_void> *this,char *psz,bool bStrict)

{
  uchar c;
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  long lVar3;
  byte *pbVar4;
  long lVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  
  if ((int)CONCAT71(in_register_00000011,bStrict) == 0) {
    psz = psz + -1;
    do {
      puVar7 = (uchar *)psz + 1;
      psz = (char *)((uchar *)psz + 1);
      iVar1 = isspace((int)(char)*puVar7);
    } while (iVar1 != 0);
  }
  if ((!bStrict) && (*psz == '0')) {
    iVar1 = tolower((int)(char)((uchar *)psz)[1]);
    psz = (char *)((uchar *)psz + (ulong)(iVar1 == 0x78) * 2);
  }
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    iVar1 = charUnHex(((uchar *)psz)[lVar5]);
    lVar3 = lVar5 + 1;
  } while (iVar1 != -1);
  puVar7 = (uchar *)psz + lVar5 + -0x20;
  if ((uint)lVar5 < 0x21) {
    puVar7 = (uchar *)psz;
  }
  lVar3 = (long)((uchar *)psz + ((lVar5 + 1) - (long)puVar7)) / 2;
  pbVar4 = (byte *)((long)this + (0x10 - lVar3));
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  if (((int)((uchar *)psz + ((lVar5 + 1) - (long)puVar7)) - 1U & 1) != 0) {
    c = *puVar7;
    puVar7 = puVar7 + 1;
    iVar1 = charUnHex(c);
    *pbVar4 = (byte)iVar1;
    pbVar4 = (byte *)((long)this + (0x11 - lVar3));
  }
  puVar6 = (uchar *)psz + lVar5;
  while( true ) {
    if (puVar6 == puVar7) {
      return *puVar6 == '\0';
    }
    puVar8 = puVar7 + 1;
    iVar1 = charUnHex(*puVar7);
    if (puVar6 == puVar8) {
      iVar2 = 0;
    }
    else {
      puVar8 = puVar7 + 2;
      iVar2 = charUnHex(puVar7[1]);
    }
    if (iVar2 == -1 || iVar1 == -1) break;
    *pbVar4 = (byte)iVar2 | (byte)(iVar1 << 4);
    pbVar4 = pbVar4 + 1;
    puVar7 = puVar8;
  }
  return false;
}

Assistant:

bool SetHex (const char* psz, bool bStrict = false)
    {
        // skip leading spaces
        if (!bStrict)
            while (isspace (*psz))
                psz++;

        // skip 0x
        if (!bStrict && psz[0] == '0' && tolower (psz[1]) == 'x')
            psz += 2;

        const unsigned char* pEnd   = reinterpret_cast<const unsigned char*> (psz);
        const unsigned char* pBegin = pEnd;

        // Find end.
        while (charUnHex(*pEnd) != -1)
            pEnd++;

        // Take only last digits of over long string.
        if ((unsigned int) (pEnd - pBegin) > 2 * size ())
            pBegin = pEnd - 2 * size ();

        unsigned char* pOut = end () - ((pEnd - pBegin + 1) / 2);

        *this = beast::zero;

        if ((pEnd - pBegin) & 1)
            *pOut++ = charUnHex(*pBegin++);

        while (pBegin != pEnd)
        {
            auto cHigh = charUnHex(*pBegin++);
            auto cLow  = pBegin == pEnd
                            ? 0
                            : charUnHex(*pBegin++);

            if (cHigh == -1 || cLow == -1)
                return false;

            *pOut++ = (cHigh << 4) | cLow;
        }

        return !*pEnd;
    }